

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readgamma.hpp
# Opt level: O1

void split<std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
               (string *s,char delim,
               back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               result)

{
  istream *piVar1;
  string item;
  istringstream iss;
  value_type local_1c8;
  istringstream local_1a8 [120];
  ios_base local_130 [264];
  
  std::__cxx11::istringstream::istringstream(local_1a8,(string *)s,_S_in);
  local_1c8._M_string_length = 0;
  local_1c8.field_2._M_local_buf[0] = '\0';
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1a8,(string *)&local_1c8,delim);
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(result.container,&local_1c8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  std::__cxx11::istringstream::~istringstream(local_1a8);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void split(const std::string &s, char delim, Out result) {
    std::istringstream iss(s);
    std::string item;
    while (std::getline(iss, item, delim)) {
        *result++ = item;
    }
}